

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertexPair*>::
emplace<QtGraphicsAnchorLayout::AnchorVertexPair*&>
          (QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertexPair_*> *this,qsizetype i,
          AnchorVertexPair **args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  AnchorVertexPair **ppAVar3;
  undefined8 *in_RDX;
  long in_RSI;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertexPair_*> *in_RDI;
  AnchorVertexPair **where;
  GrowthPosition pos;
  AnchorVertexPair *tmp;
  bool detach;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertexPair_*> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  AnchorVertexPair *pAVar5;
  undefined7 in_stack_ffffffffffffffe0;
  
  uVar1 = QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertexPair_*>::needsDetach(in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->size) &&
       (qVar2 = QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertexPair_*>::freeSpaceAtEnd
                          (in_stack_ffffffffffffffc8), qVar2 != 0)) {
      ppAVar3 = QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertexPair_*>::end(in_RDI);
      *ppAVar3 = (AnchorVertexPair *)*in_RDX;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
    if ((in_RSI == 0) &&
       (qVar2 = QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertexPair_*>::freeSpaceAtBegin
                          (in_stack_ffffffffffffffc8), qVar2 != 0)) {
      ppAVar3 = QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertexPair_*>::begin
                          ((QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertexPair_*> *)0x95aa77
                          );
      ppAVar3[-1] = (AnchorVertexPair *)*in_RDX;
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
  }
  pAVar5 = (AnchorVertexPair *)*in_RDX;
  uVar4 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertexPair_*>::detachAndGrow
            ((QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertexPair_*> *)
             CONCAT17(uVar1,in_stack_ffffffffffffffe0),(GrowthPosition)((ulong)pAVar5 >> 0x20),
             CONCAT44(uVar4,in_stack_ffffffffffffffd0),
             (AnchorVertexPair ***)in_stack_ffffffffffffffc8,in_RDI);
  ppAVar3 = QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertexPair_*>::createHole
                      ((QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertexPair_*> *)
                       CONCAT17(uVar1,in_stack_ffffffffffffffe0),
                       (GrowthPosition)((ulong)pAVar5 >> 0x20),
                       CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                       (qsizetype)in_stack_ffffffffffffffc8);
  *ppAVar3 = pAVar5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }